

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t * container_inot(container_t *c,uint8_t type,uint8_t *result_type)

{
  undefined1 *puVar1;
  _Bool _Var2;
  undefined1 uVar3;
  uint uVar4;
  int iVar5;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  byte in_SIL;
  container_t *result;
  bitset_container_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  puVar1 = (undefined1 *)CONCAT71(in_register_00000011,in_DL);
  get_writable_copy_if_shared(in_stack_ffffffffffffffc8,(uint8_t *)0x15e9a4);
  uVar4 = (uint)in_SIL;
  if (uVar4 == 1) {
    _Var2 = bitset_container_negation_inplace
                      ((bitset_container_t *)(ulong)CONCAT14(in_SIL,in_stack_ffffffffffffffd0),
                       (container_t **)in_stack_ffffffffffffffc8);
    uVar3 = 2;
    if (_Var2) {
      uVar3 = 1;
    }
    *puVar1 = uVar3;
    local_8 = (bitset_container_t *)0x0;
  }
  else if (uVar4 == 2) {
    local_8 = bitset_container_create();
    *puVar1 = 1;
    array_container_negation
              ((array_container_t *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    array_container_free((array_container_t *)0x15ea30);
  }
  else {
    iVar5 = run_container_negation_inplace
                      ((run_container_t *)(ulong)CONCAT14(in_SIL,in_stack_ffffffffffffffd0),
                       (container_t **)in_stack_ffffffffffffffc8);
    *puVar1 = (char)iVar5;
    local_8 = (bitset_container_t *)0x0;
  }
  return local_8;
}

Assistant:

static inline container_t *container_inot(container_t *c, uint8_t type,
                                          uint8_t *result_type) {
    c = get_writable_copy_if_shared(c, &type);
    container_t *result = NULL;
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            *result_type =
                bitset_container_negation_inplace(CAST_bitset(c), &result)
                    ? BITSET_CONTAINER_TYPE
                    : ARRAY_CONTAINER_TYPE;
            return result;
        case ARRAY_CONTAINER_TYPE:
            // will never be inplace
            result = bitset_container_create();
            *result_type = BITSET_CONTAINER_TYPE;
            array_container_negation(CAST_array(c), CAST_bitset(result));
            array_container_free(CAST_array(c));
            return result;
        case RUN_CONTAINER_TYPE:
            *result_type =
                (uint8_t)run_container_negation_inplace(CAST_run(c), &result);
            return result;

        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return NULL;
}